

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O2

QDateTime __thiscall QFileSystemMetaData::metadataChangeTime(QFileSystemMetaData *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  Data local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RSI + 0x20) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
  }
  else {
    local_18 = (Data)0x2;
    QDateTime::fromMSecsSinceEpoch
              ((QDateTime *)this,*(long *)(in_RSI + 0x20),(QTimeZone *)&local_18.s);
    QTimeZone::~QTimeZone((QTimeZone *)&local_18.s);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return (QDateTime)(Data)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QDateTime QFileSystemMetaData::metadataChangeTime() const
{
    return metadataChangeTime_
        ? QDateTime::fromMSecsSinceEpoch(metadataChangeTime_, QTimeZone::UTC)
        : QDateTime();
}